

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudDrv_Pulse.c
# Opt level: O2

UINT8 Pulse_Start(void *drvObj,UINT32 deviceID,AUDIO_OPTS *options,void *audDrvParam)

{
  byte bVar1;
  uint uVar2;
  undefined1 auVar3 [12];
  UINT8 UVar4;
  int iVar5;
  long lVar6;
  void *pvVar7;
  UINT32 UVar8;
  AUDIO_OPTS *pAVar9;
  byte bVar10;
  DRV_PULSE *drv;
  
  if (*(char *)((long)drvObj + 8) != '\0') {
    return 0xd0;
  }
  *(void **)drvObj = audDrvParam;
  pAVar9 = &defOptions;
  if (options != (AUDIO_OPTS *)0x0) {
    pAVar9 = options;
  }
  bVar10 = pAVar9->numChannels;
  *(byte *)((long)drvObj + 0x14) = bVar10;
  uVar2 = pAVar9->sampleRate;
  *(uint *)((long)drvObj + 0x10) = uVar2;
  auVar3._8_4_ = 0;
  auVar3._0_8_ = (ulong)pAVar9->usecPerBuf * (ulong)uVar2 + 500000;
  iVar5 = SUB124(auVar3 / ZEXT812(1000000),0);
  *(int *)((long)drvObj + 0x18) = iVar5;
  bVar1 = pAVar9->numBitsPerSmpl;
  *(uint *)((long)drvObj + 0x1c) = ((uint)bVar1 * (uint)bVar10 >> 3) * iVar5;
  UVar8 = 10;
  if (pAVar9->numBuffers != 0) {
    UVar8 = pAVar9->numBuffers;
  }
  *(UINT32 *)((long)drvObj + 0x20) = UVar8;
  bVar10 = bVar1 * ' ' | (byte)(bVar1 - 8) >> 3;
  UVar4 = 0xcf;
  if (bVar10 < 4) {
    *(undefined4 *)((long)drvObj + 0xc) = *(undefined4 *)(&DAT_001606b8 + (ulong)bVar10 * 4);
    *(undefined1 *)((long)drvObj + 0x51) = 1;
    lVar6 = pa_simple_new(0,"libvgm",1,0,*(undefined8 *)((long)drvObj + 0x58),(long)drvObj + 0xc,0,0
                          ,0);
    *(long *)((long)drvObj + 0x48) = lVar6;
    if (lVar6 == 0) {
      UVar4 = 0xc0;
    }
    else {
      OSSignal_Reset(*(OS_SIGNAL **)((long)drvObj + 0x38));
      UVar4 = OSThread_Init((OS_THREAD **)((long)drvObj + 0x30),PulseThread,drvObj);
      if (UVar4 == '\0') {
        pvVar7 = malloc((ulong)*(uint *)((long)drvObj + 0x1c));
        *(void **)((long)drvObj + 0x28) = pvVar7;
        *(undefined1 *)((long)drvObj + 8) = 1;
        *(undefined1 *)((long)drvObj + 0x50) = 0;
        OSSignal_Signal(*(OS_SIGNAL **)((long)drvObj + 0x38));
        UVar4 = '\0';
      }
      else {
        pa_simple_free(*(undefined8 *)((long)drvObj + 0x48));
        UVar4 = 200;
      }
    }
  }
  return UVar4;
}

Assistant:

UINT8 Pulse_Start(void* drvObj, UINT32 deviceID, AUDIO_OPTS* options, void* audDrvParam)
{
	DRV_PULSE* drv = (DRV_PULSE*)drvObj;
	UINT64 tempInt64;
	UINT8 retVal8;
	
	if (drv->devState != 0)
		return 0xD0;	// already running
	
	drv->audDrvPtr = audDrvParam;
	if (options == NULL)
		options = &defOptions;
	drv->pulseFmt.channels = options->numChannels;
	drv->pulseFmt.rate = options->sampleRate;
	
	tempInt64 = (UINT64)options->sampleRate * options->usecPerBuf;
	drv->bufSmpls = (UINT32)((tempInt64 + 500000) / 1000000);
	drv->bufSize = (options->numBitsPerSmpl * drv->pulseFmt.channels / 8) * drv->bufSmpls;
	drv->bufCount = options->numBuffers ? options->numBuffers : 10;
	
	if (options->numBitsPerSmpl == 8)
		drv->pulseFmt.format = PA_SAMPLE_U8;
	else if (options->numBitsPerSmpl == 16)
		drv->pulseFmt.format = PA_SAMPLE_S16NE;
	else if (options->numBitsPerSmpl == 24)
		drv->pulseFmt.format = PA_SAMPLE_S24NE;
	else if (options->numBitsPerSmpl == 32)
		drv->pulseFmt.format = PA_SAMPLE_S32NE;
	else
		return 0xCF;
	
	drv->canPause = 1;
	
	drv->hPulse = pa_simple_new(NULL, "libvgm", PA_STREAM_PLAYBACK, NULL, drv->streamDesc, &drv->pulseFmt, NULL, NULL, NULL);
	if(!drv->hPulse)
		return 0xC0;
	
	OSSignal_Reset(drv->hSignal);
	retVal8 = OSThread_Init(&drv->hThread, &PulseThread, drv);
	if (retVal8)
	{
		pa_simple_free(drv->hPulse);
		return 0xC8;	// CreateThread failed
	}
	
	drv->bufSpace = (UINT8*)malloc(drv->bufSize);
	
	drv->devState = 1;
	drv->pauseThread = 0x00;
	OSSignal_Signal(drv->hSignal);
	
	return AERR_OK;
}